

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

size_t encoder_7bit_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = (part->encstate).bufbeg;
  uVar2 = (part->encstate).bufend - sVar4;
  if (size <= uVar2) {
    uVar2 = size;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar2 == uVar3) {
      return uVar2;
    }
    cVar1 = (part->encstate).buf[sVar4];
    buffer[uVar3] = cVar1;
    if (cVar1 < '\0') break;
    sVar4 = (part->encstate).bufbeg + 1;
    (part->encstate).bufbeg = sVar4;
    uVar3 = uVar3 + 1;
  }
  return -(ulong)(uVar3 == 0) | uVar3;
}

Assistant:

static size_t encoder_7bit_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t cursize = st->bufend - st->bufbeg;

  (void) ateof;

  if(size > cursize)
    size = cursize;

  for(cursize = 0; cursize < size; cursize++) {
    *buffer = st->buf[st->bufbeg];
    if(*buffer++ & 0x80)
      return cursize? cursize: READ_ERROR;
    st->bufbeg++;
  }

  return cursize;
}